

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O3

void av1_calc_proj_params_c
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      return;
    }
    if (0 < height) {
      uVar4 = 0;
      do {
        if (0 < width) {
          uVar6 = 0;
          do {
            bVar1 = dat8[uVar6];
            bVar2 = src8[uVar6];
            lVar5 = (long)flt1[uVar6] + (ulong)bVar1 * -0x10;
            H[1][1] = H[1][1] + lVar5 * lVar5;
            C[1] = C[1] + ((ulong)bVar2 - (ulong)bVar1) * lVar5 * 0x10;
            uVar6 = uVar6 + 1;
          } while ((uint)width != uVar6);
        }
        uVar4 = uVar4 + 1;
        flt1 = flt1 + flt1_stride;
        src8 = src8 + src_stride;
        dat8 = dat8 + dat_stride;
      } while (uVar4 != (uint)height);
    }
    lVar5 = (long)(height * width);
    H[1][1] = H[1][1] / lVar5;
  }
  else {
    if (params->r[1] < 1) {
      if (0 < height) {
        uVar4 = 0;
        do {
          if (0 < width) {
            uVar6 = 0;
            do {
              bVar1 = dat8[uVar6];
              bVar2 = src8[uVar6];
              lVar5 = (long)flt0[uVar6] + (ulong)bVar1 * -0x10;
              (*H)[0] = (*H)[0] + lVar5 * lVar5;
              *C = *C + ((ulong)bVar2 - (ulong)bVar1) * lVar5 * 0x10;
              uVar6 = uVar6 + 1;
            } while ((uint)width != uVar6);
          }
          uVar4 = uVar4 + 1;
          flt0 = flt0 + flt0_stride;
          src8 = src8 + src_stride;
          dat8 = dat8 + dat_stride;
        } while (uVar4 != (uint)height);
      }
      lVar5 = (long)(height * width);
      (*H)[0] = (*H)[0] / lVar5;
      goto LAB_001fabc5;
    }
    if (0 < height) {
      uVar4 = 0;
      do {
        if (0 < width) {
          uVar6 = 0;
          do {
            bVar1 = dat8[uVar6];
            bVar2 = src8[uVar6];
            lVar8 = (long)flt0[uVar6] + (ulong)bVar1 * -0x10;
            iVar3 = flt1[uVar6];
            (*H)[0] = (*H)[0] + lVar8 * lVar8;
            lVar5 = ((ulong)bVar2 - (ulong)bVar1) * 0x10;
            lVar7 = (long)iVar3 + (ulong)bVar1 * -0x10;
            H[1][1] = H[1][1] + lVar7 * lVar7;
            (*H)[1] = (*H)[1] + lVar7 * lVar8;
            *C = *C + lVar8 * lVar5;
            C[1] = C[1] + lVar7 * lVar5;
            uVar6 = uVar6 + 1;
          } while ((uint)width != uVar6);
        }
        uVar4 = uVar4 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        src8 = src8 + src_stride;
        dat8 = dat8 + dat_stride;
      } while (uVar4 != (uint)height);
    }
    lVar5 = (long)(height * width);
    lVar7 = (*H)[1];
    (*H)[0] = (*H)[0] / lVar5;
    lVar7 = lVar7 / lVar5;
    (*H)[1] = lVar7;
    H[1][1] = H[1][1] / lVar5;
    H[1][0] = lVar7;
    *C = *C / lVar5;
  }
  C = C + 1;
LAB_001fabc5:
  *C = *C / lVar5;
  return;
}

Assistant:

void av1_calc_proj_params_c(const uint8_t *src8, int width, int height,
                            int src_stride, const uint8_t *dat8, int dat_stride,
                            int32_t *flt0, int flt0_stride, int32_t *flt1,
                            int flt1_stride, int64_t H[2][2], int64_t C[2],
                            const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_c(src8, width, height, src_stride, dat8, dat_stride,
                             flt0, flt0_stride, flt1, flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_c(src8, width, height, src_stride, dat8, dat_stride,
                          flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_c(src8, width, height, src_stride, dat8, dat_stride,
                          flt1, flt1_stride, H, C);
  }
}